

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O3

void AM_drawThings(void)

{
  ushort uVar1;
  AInventory *key;
  double dVar2;
  PClass *pPVar3;
  byte bVar4;
  int iVar5;
  undefined4 extraout_var;
  uint uVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  FTexture *tex;
  uint uVar12;
  bool bVar13;
  double dVar14;
  AMColor color;
  AMColor local_68;
  double local_60;
  double local_58;
  double dStack_50;
  DAngle local_48;
  DAngle local_40;
  DAngle local_38;
  PClass *pPVar6;
  
  if (0 < numsectors) {
    lVar10 = 0;
    iVar5 = numsectors;
    do {
      for (key = (AInventory *)sectors[lVar10].thinglist; key != (AInventory *)0x0;
          key = (AInventory *)(key->super_AActor).snext) {
        if ((0 < am_cheat.Value) || (((key->super_AActor).flags6.Value & 0x40000000) == 0)) {
          iVar5 = ((key->super_AActor).Sector)->PortalGroup;
          local_58 = 0.0;
          dStack_50 = 0.0;
          if (iVar5 != MapPortalGroup) {
            local_58 = Displacements.data.Array[MapPortalGroup * Displacements.size + iVar5].pos.X;
            dStack_50 = Displacements.data.Array[MapPortalGroup * Displacements.size + iVar5].pos.Y;
          }
          local_58 = (key->super_AActor).__Pos.X + local_58;
          dStack_50 = (key->super_AActor).__Pos.Y + dStack_50;
          if ((0 < am_showthingsprites.Value) &&
             (lVar9 = (long)(key->super_AActor).sprite, 0 < lVar9)) {
            uVar1 = sprites.Array[lVar9].spriteframes;
            dVar14 = 270.0 - (key->super_AActor).Angles.Yaw.Degrees;
            uVar7 = am_showthingsprites.Value;
            do {
              if (uVar7 < 2) {
                uVar8 = 0;
              }
              else {
                uVar8 = (uint)(key->super_AActor).frame;
              }
              uVar11 = (ulong)(uVar8 * 0x50);
              dVar2 = dVar14;
              if (*(int *)((long)&(SpriteFrames.Array)->Texture[0].texnum +
                          uVar11 + (uint)uVar1 * 0x50) !=
                  *(int *)((long)&(SpriteFrames.Array)->Texture[1].texnum +
                          uVar11 + (uint)uVar1 * 0x50)) {
                dVar2 = dVar14 + 11.25;
              }
              if ((am_rotate.Value == 1) || ((am_rotate.Value == 2 && ((viewactive & 1U) != 0)))) {
                dVar2 = dVar2 + *(double *)((&DAT_017e1fb8)[(long)consoleplayer * 0x54] + 0xb0) +
                                -90.0;
              }
              lVar9 = uVar11 + (uint)uVar1 * 0x50;
              uVar12 = (uint)((double)((ulong)(dVar2 * 11930464.711111112 + 6755399441055744.0) &
                                      0xffffffff) * 8.381903171539307e-08 * 0.044444444444444446);
              uVar8 = 0;
              if (2 < uVar7) {
                uVar8 = uVar12;
              }
              uVar11 = (ulong)*(int *)((long)&(SpriteFrames.Array)->Texture[(int)uVar8].texnum +
                                      lVar9);
              if (uVar11 < TexMan.Textures.Count) {
                tex = TexMan.Textures.Array[TexMan.Translation.Array[uVar11]].Texture;
              }
              else {
                tex = (FTexture *)0x0;
              }
            } while ((uVar7 != 1) && (uVar7 = uVar7 - 1, tex == (FTexture *)0x0));
            if (tex != (FTexture *)0x0) {
              DrawMarker(tex,local_58,dStack_50,0,
                         (uint)((*(ushort *)((long)((SpriteFrames.Array)->Texture + 0x10) + lVar9)
                                 >> (uVar12 & 0x1f) & 1) != 0),
                         (key->super_AActor).Scale.X * 0.625 * scale_mtof,
                         (key->super_AActor).Scale.Y * 0.625 * scale_mtof,
                         (key->super_AActor).Translation,1.0,0,LegacyRenderStyles[1]);
              goto LAB_0034a396;
            }
          }
          dVar14 = (key->super_AActor).Angles.Yaw.Degrees;
          if ((am_rotate.Value == 1) || ((am_rotate.Value == 2 && (viewactive == true)))) {
            local_60 = dVar14;
            AM_rotatePoint(&local_58,&dStack_50);
            dVar14 = local_60 +
                     (90.0 - *(double *)((&DAT_017e1fb8)[(long)consoleplayer * 0x54] + 0xb0));
          }
          pPVar3 = AKey::RegistrationInfo.MyClass;
          local_68 = AMColors.c[7];
          uVar7 = (key->super_AActor).flags.Value;
          if (((uVar7 >> 0x14 & 1) == 0 &
              *(byte *)((long)&(key->super_AActor).flags3.Value + 1) >> 5) == 1) {
            local_68 = AMColors.c[0xc];
            if (((uVar7 >> 0x1b & 1) == 0) && (local_68 = AMColors.c[10], (uVar7 >> 0x16 & 1) == 0))
            {
              local_68 = AMColors.c[0xb];
            }
LAB_0034a2af:
            if (local_68.Index != -1) {
              local_60 = dVar14;
              local_40.Degrees = dVar14;
              AM_drawLineCharacter(thintriangle_guy,3,16.0,&local_40,&local_68,local_58,dStack_50);
              dVar14 = local_60;
            }
          }
          else {
            if ((uVar7 & 1) == 0) goto LAB_0034a2af;
            pPVar6 = (key->super_AActor).super_DThinker.super_DObject.Class;
            if (pPVar6 == (PClass *)0x0) {
              local_60 = dVar14;
              iVar5 = (**(key->super_AActor).super_DThinker.super_DObject._vptr_DObject)(key);
              pPVar6 = (PClass *)CONCAT44(extraout_var,iVar5);
              (key->super_AActor).super_DThinker.super_DObject.Class = pPVar6;
              dVar14 = local_60;
            }
            bVar13 = pPVar6 != (PClass *)0x0;
            if (pPVar6 != pPVar3 && bVar13) {
              do {
                pPVar6 = pPVar6->ParentClass;
                bVar13 = pPVar6 != (PClass *)0x0;
                if (pPVar6 == pPVar3) break;
              } while (pPVar6 != (PClass *)0x0);
            }
            if (!bVar13) {
              local_68 = AMColors.c[9];
              if (((key->super_AActor).flags.Value & 0x800000) == 0) {
                local_68 = AMColors.c[8];
              }
              goto LAB_0034a2af;
            }
            local_60 = dVar14;
            iVar5 = G_SkillProperty(SKILLP_EasyKey);
            if (iVar5 == 0) {
              if (am_showkeys.Value != true) {
                local_68 = AMColors.c[8];
                dVar14 = local_60;
                goto LAB_0034a2af;
              }
              uVar7 = P_GetMapColorForKey(key);
              if ((int)uVar7 < 0) {
                local_68 = AMColors.c[9];
              }
              else {
                uVar8 = uVar7 >> 8 & 0xff;
                local_68.RGB = ((uVar7 & 0xff) + (uVar8 << 8 | uVar7 & 0xff0000)) - 0x1000000;
                bVar4 = FColorMatcher::Pick(&ColorMatcher,uVar7 >> 0x10 & 0xff,uVar8,uVar7 & 0xff);
                local_68.Index = (uint)bVar4;
              }
              local_38.Degrees = 0.0;
              AM_drawLineCharacter
                        (CheatKey.Array,CheatKey.Count,0.0,&local_38,&local_68,local_58,dStack_50);
            }
            local_68.Index = -1;
            dVar14 = local_60;
          }
          if ((am_cheat.Value == 6) || (am_cheat.Value == 3)) {
            local_48.Degrees = dVar14 - (key->super_AActor).Angles.Yaw.Degrees;
            AM_drawLineCharacter
                      (AM_drawThings::box,4,(key->super_AActor).radius,&local_48,&local_68,local_58,
                       dStack_50);
          }
        }
LAB_0034a396:
        iVar5 = numsectors;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < iVar5);
  }
  return;
}

Assistant:

void AM_drawThings ()
{
	AMColor color;
	int		 i;
	AActor*	 t;
	mpoint_t p;
	DAngle	 angle;

	for (i=0;i<numsectors;i++)
	{
		t = sectors[i].thinglist;
		while (t)
		{
			if (am_cheat > 0 || !(t->flags6 & MF6_NOTONAUTOMAP))
			{
				DVector3 pos = t->PosRelative(MapPortalGroup);
				p.x = pos.X;
				p.y = pos.Y;

				if (am_showthingsprites > 0 && t->sprite > 0)
				{
					FTexture *texture = NULL;
					spriteframe_t *frame;
					int rotation = 0;

					// try all modes backwards until a valid texture has been found.	
					for(int show = am_showthingsprites; show > 0 && texture == NULL; show--)
					{
						const spritedef_t& sprite = sprites[t->sprite];
						const size_t spriteIndex = sprite.spriteframes + (show > 1 ? t->frame : 0);

						frame = &SpriteFrames[spriteIndex];
						DAngle angle = 270. -t->Angles.Yaw;
						if (frame->Texture[0] != frame->Texture[1]) angle += 180. / 16;
						if (am_rotate == 1 || (am_rotate == 2 && viewactive))
						{
							angle += players[consoleplayer].camera->Angles.Yaw - 90.;
						}
						rotation = int((angle.Normalized360() * (16. / 360.)).Degrees);

						const FTextureID textureID = frame->Texture[show > 2 ? rotation : 0];
						texture = TexMan(textureID);
					}

					if (texture == NULL) goto drawTriangle;	// fall back to standard display if no sprite can be found.

					const double spriteXScale = (t->Scale.X * (10. / 16.) * scale_mtof);
					const double spriteYScale = (t->Scale.Y * (10. / 16.) * scale_mtof);

					DrawMarker (texture, p.x, p.y, 0, !!(frame->Flip & (1 << rotation)),
						spriteXScale, spriteYScale, t->Translation, 1., 0, LegacyRenderStyles[STYLE_Normal]);
				}
				else
				{
			drawTriangle:
					angle = t->Angles.Yaw;

					if (am_rotate == 1 || (am_rotate == 2 && viewactive))
					{
						AM_rotatePoint (&p.x, &p.y);
						angle += -players[consoleplayer].camera->Angles.Yaw + 90.;
					}

					color = AMColors[AMColors.ThingColor];

					// use separate colors for special thing types
					if (t->flags3&MF3_ISMONSTER && !(t->flags&MF_CORPSE))
					{
						if (t->flags & MF_FRIENDLY) color = AMColors[AMColors.ThingColor_Friend];
						else if (!(t->flags & MF_COUNTKILL)) color = AMColors[AMColors.ThingColor_NocountMonster];
						else color = AMColors[AMColors.ThingColor_Monster];
					}
					else if (t->flags&MF_SPECIAL)
					{
						// Find the key's own color.
						// Only works correctly if single-key locks have lower numbers than any-key locks.
						// That is the case for all default keys, however.
						if (t->IsKindOf(RUNTIME_CLASS(AKey)))
						{
							if (G_SkillProperty(SKILLP_EasyKey))
							{
								// Already drawn by AM_drawKeys(), so don't draw again
								color.Index = -1;
							}
							else if (am_showkeys)
							{
								int P_GetMapColorForKey (AInventory * key);
								int c = P_GetMapColorForKey(static_cast<AKey *>(t));

								if (c >= 0)	color.FromRGB(RPART(c), GPART(c), BPART(c));
								else color = AMColors[AMColors.ThingColor_CountItem];
								AM_drawLineCharacter(&CheatKey[0], CheatKey.Size(), 0, 0., color, p.x, p.y);
								color.Index = -1;
							}
							else
							{
								color = AMColors[AMColors.ThingColor_Item];
							}
						}
						else if (t->flags&MF_COUNTITEM)
							color = AMColors[AMColors.ThingColor_CountItem];
						else
							color = AMColors[AMColors.ThingColor_Item];
					}

					if (color.Index != -1)
					{
						AM_drawLineCharacter(thintriangle_guy, NUMTHINTRIANGLEGUYLINES,	16, angle, color, p.x, p.y);
					}

					if (am_cheat == 3 || am_cheat == 6)
					{
						static const mline_t box[4] =
						{
							{ { -1, -1 }, {  1, -1 } },
							{ {  1, -1 }, {  1,  1 } },
							{ {  1,  1 }, { -1,  1 } },
							{ { -1,  1 }, { -1, -1 } },
						};

						AM_drawLineCharacter (box, 4, t->radius, angle - t->Angles.Yaw, color, p.x, p.y);
					}
				}
			}
			t = t->snext;
		}
	}
}